

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::backward::NeHelper<false>::
Compare<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
          (AssertionResult *__return_storage_ptr__,NeHelper<false> *this,char *expr1,char *expr2,
          iu_basic_string_view<char,_std::char_traits<char>_> *val1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val2_local;
  iu_basic_string_view<char,_std::char_traits<char>_> *val1_local;
  char *expr2_local;
  char *expr1_local;
  
  CmpHelperNE<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (__return_storage_ptr__,(internal *)this,expr1,expr2,val1,val2);
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Compare(const char* expr1, const char* expr2, const T1& val1, const T2& val2)
    {
        return CmpHelperNE(expr1, expr2, val1, val2);
    }